

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<char[15],long>(ostream *out,char *fmt,char (*args) [15],long *args_1)

{
  long in_FS_OFFSET;
  FormatList local_48;
  FormatArg local_38;
  long *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_args = &local_38;
  local_48.m_N = 2;
  local_38.m_formatImpl = detail::FormatArg::formatImpl<char[15]>;
  local_38.m_toIntImpl = detail::FormatArg::toIntImpl<char[15]>;
  local_18 = detail::FormatArg::formatImpl<long>;
  local_10 = detail::FormatArg::toIntImpl<long>;
  local_38.m_value = args;
  local_20 = args_1;
  vformat(out,fmt,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}